

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_pass(REF_GRID ref_grid)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  REF_INT local_12c;
  REF_INT local_128;
  int local_124;
  double local_120;
  double local_118;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ref_malloc_init_i_1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL edge_ratio;
  REF_INT nodes [27];
  REF_INT local_74;
  int local_70;
  REF_INT cell;
  REF_INT item;
  REF_INT edge;
  REF_INT i;
  REF_INT node1;
  REF_INT node0;
  REF_INT node;
  REF_INT *node2target;
  REF_INT *target;
  REF_INT *pRStack_40;
  REF_INT ntarget;
  REF_INT *order;
  REF_DBL *ratio;
  REF_EDGE ref_edge;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  if (ref_grid->surf == 0) {
    ref_edge = (REF_EDGE)ref_grid->cell[8];
  }
  else {
    ref_edge = (REF_EDGE)ref_grid->cell[3];
  }
  ref_node = (REF_NODE)ref_grid;
  uVar3 = ref_edge_create((REF_EDGE *)&ratio,ref_grid);
  if (uVar3 == 0) {
    if (ref_cell->last_node_is_an_id < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x6b,"ref_collapse_pass","malloc ratio of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      order = (REF_INT *)malloc((long)ref_cell->last_node_is_an_id << 3);
      if (order == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x6b,"ref_collapse_pass","malloc ratio of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < ref_cell->last_node_is_an_id;
            ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
          *(double *)(order + (long)ref_malloc_init_i_1 * 2) =
               *(double *)(*(long *)&ref_node[1].blank + 0x20) * 2.0;
        }
        for (cell = 0; cell < *(int *)ratio; cell = cell + 1) {
          i = *(REF_INT *)((long)ratio[1] + (long)(cell << 1) * 4);
          iVar2 = *(int *)((long)ratio[1] + (long)(cell * 2 + 1) * 4);
          uVar3 = ref_node_ratio((REF_NODE)ref_cell,i,iVar2,(REF_DBL *)&ref_malloc_init_i);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x70,"ref_collapse_pass",(ulong)uVar3,"ratio");
            return uVar3;
          }
          if (_ref_malloc_init_i <= *(double *)(order + (long)i * 2)) {
            local_118 = _ref_malloc_init_i;
          }
          else {
            local_118 = *(double *)(order + (long)i * 2);
          }
          *(double *)(order + (long)i * 2) = local_118;
          if (_ref_malloc_init_i <= *(double *)(order + (long)iVar2 * 2)) {
            local_120 = _ref_malloc_init_i;
          }
          else {
            local_120 = *(double *)(order + (long)iVar2 * 2);
          }
          *(double *)(order + (long)iVar2 * 2) = local_120;
        }
        if ((int)ref_cell->type < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x75,"ref_collapse_pass","malloc target of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          node2target = (REF_INT *)malloc((long)(int)ref_cell->type << 2);
          if (node2target == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x75,"ref_collapse_pass","malloc target of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else if (ref_cell->last_node_is_an_id < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x76,"ref_collapse_pass","malloc node2target of REF_INT negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            _node0 = malloc((long)ref_cell->last_node_is_an_id << 2);
            if (_node0 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x76,"ref_collapse_pass","malloc node2target of REF_INT NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_3 = 0;
                  ref_private_macro_code_rss_3 < ref_cell->last_node_is_an_id;
                  ref_private_macro_code_rss_3 = ref_private_macro_code_rss_3 + 1) {
                *(undefined4 *)((long)_node0 + (long)ref_private_macro_code_rss_3 * 4) = 0xffffffff;
              }
              target._4_4_ = 0;
              for (node1 = 0; node1 < ref_cell->last_node_is_an_id; node1 = node1 + 1) {
                if (*(double *)(order + (long)node1 * 2) <
                    *(double *)(*(long *)&ref_node[1].blank + 0x20)) {
                  *(int *)((long)_node0 + (long)node1 * 4) = target._4_4_;
                  node2target[target._4_4_] = node1;
                  *(undefined8 *)(order + (long)target._4_4_ * 2) =
                       *(undefined8 *)(order + (long)node1 * 2);
                  target._4_4_ = target._4_4_ + 1;
                }
              }
              if (target._4_4_ < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x81,"ref_collapse_pass","malloc order of REF_INT negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                pRStack_40 = (REF_INT *)malloc((long)target._4_4_ << 2);
                if (pRStack_40 == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0x81,"ref_collapse_pass","malloc order of REF_INT NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  uVar3 = ref_sort_heap_dbl(target._4_4_,(REF_DBL *)order,pRStack_40);
                  if (uVar3 == 0) {
                    for (item = 0; item < target._4_4_; item = item + 1) {
                      pdVar1 = (double *)(*(long *)&ref_node[1].blank + 0x20);
                      if ((((*(double *)(order + (long)pRStack_40[item] * 2) < *pdVar1 ||
                             *(double *)(order + (long)pRStack_40[item] * 2) == *pdVar1) &&
                           (iVar2 = node2target[pRStack_40[item]], -1 < iVar2)) &&
                          (iVar2 < ref_cell->last_node_is_an_id)) &&
                         (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)iVar2 * 8))) {
                        uVar3 = ref_collapse_to_remove_node1((REF_GRID)ref_node,&i,iVar2);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                 ,0x89,"ref_collapse_pass",(ulong)uVar3,"collapse rm");
                          return uVar3;
                        }
                        if (((iVar2 < 0) || (ref_cell->last_node_is_an_id <= iVar2)) ||
                           (*(long *)(*(long *)&ref_cell->edge_per + (long)iVar2 * 8) < 0)) {
                          *(undefined4 *)(*(long *)&ref_cell->blank + (long)i * 4) = 0;
                          if ((i < 0) || (**(int **)(ref_edge + 2) <= i)) {
                            local_124 = -1;
                          }
                          else {
                            local_124 = *(int *)(*(long *)(*(long *)(ref_edge + 2) + 8) +
                                                (long)i * 4);
                          }
                          local_70 = local_124;
                          if (local_124 == -1) {
                            local_128 = -1;
                          }
                          else {
                            local_128 = *(REF_INT *)
                                         (*(long *)(*(long *)(ref_edge + 2) + 0x10) + 4 +
                                         (long)local_124 * 8);
                          }
                          local_74 = local_128;
                          while (local_70 != -1) {
                            uVar3 = ref_cell_nodes((REF_CELL)ref_edge,local_74,
                                                   (REF_INT *)&edge_ratio);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                     ,0x8d,"ref_collapse_pass",(ulong)uVar3,"cell nodes");
                              return uVar3;
                            }
                            for (node1 = 0; node1 < *(int *)((long)&ref_edge->e2n + 4);
                                node1 = node1 + 1) {
                              if (*(int *)((long)_node0 + (long)nodes[(long)node1 + -2] * 4) != -1)
                              {
                                *(double *)
                                 (order + (long)*(int *)((long)_node0 +
                                                        (long)nodes[(long)node1 + -2] * 4) * 2) =
                                     *(double *)(*(long *)&ref_node[1].blank + 0x20) * 2.0;
                              }
                            }
                            local_70 = *(int *)(*(long *)(*(long *)(ref_edge + 2) + 0x10) +
                                               (long)local_70 * 8);
                            if (local_70 == -1) {
                              local_12c = -1;
                            }
                            else {
                              local_12c = *(REF_INT *)
                                           (*(long *)(*(long *)(ref_edge + 2) + 0x10) + 4 +
                                           (long)local_70 * 8);
                            }
                            local_74 = local_12c;
                          }
                        }
                      }
                    }
                    if (pRStack_40 != (REF_INT *)0x0) {
                      free(pRStack_40);
                    }
                    if (_node0 != (void *)0x0) {
                      free(_node0);
                    }
                    if (node2target != (REF_INT *)0x0) {
                      free(node2target);
                    }
                    if (order != (REF_INT *)0x0) {
                      free(order);
                    }
                    ref_edge_free((REF_EDGE)ratio);
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                           ,0x83,"ref_collapse_pass",(ulong)uVar3,"sort lengths");
                    ref_grid_local._4_4_ = uVar3;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x68
           ,"ref_collapse_pass",(ulong)uVar3,"orig edges");
    ref_grid_local._4_4_ = uVar3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *order;
  REF_INT ntarget, *target, *node2target;
  REF_INT node, node0, node1;
  REF_INT i, edge;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL edge_ratio;

  if (ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ref_malloc(target, ref_node_n(ref_node), REF_INT);
  ref_malloc_init(node2target, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      node2target[node] = ntarget;
      target[ntarget] = node;
      ratio[ntarget] = ratio[node];
      ntarget++;
    }

  ref_malloc(order, ntarget, REF_INT);

  RSS(ref_sort_heap_dbl(ntarget, ratio, order), "sort lengths");

  for (i = 0; i < ntarget; i++) {
    if (ratio[order[i]] > ref_grid_adapt(ref_grid, collapse_ratio)) continue;
    node1 = target[order[i]];
    if (!ref_node_valid(ref_node, node1)) continue;
    RSS(ref_collapse_to_remove_node1(ref_grid, &node0, node1), "collapse rm");
    if (!ref_node_valid(ref_node, node1)) {
      ref_node_age(ref_node, node0) = 0;
      each_ref_cell_having_node(ref_cell, node0, item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (REF_EMPTY != node2target[nodes[node]]) {
            ratio[node2target[nodes[node]]] =
                2.0 * ref_grid_adapt(ref_grid, collapse_ratio);
          }
        }
      }
    }
  }

  ref_free(order);
  ref_free(node2target);
  ref_free(target);
  ref_free(ratio);

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}